

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

char * TextureTypeToString(aiTextureType in)

{
  char *pcStack_10;
  aiTextureType in_local;
  
  switch(in) {
  case aiTextureType_NONE:
    pcStack_10 = "n/a";
    break;
  case aiTextureType_DIFFUSE:
    pcStack_10 = "Diffuse";
    break;
  case aiTextureType_SPECULAR:
    pcStack_10 = "Specular";
    break;
  case aiTextureType_AMBIENT:
    pcStack_10 = "Ambient";
    break;
  case aiTextureType_EMISSIVE:
    pcStack_10 = "Emissive";
    break;
  case aiTextureType_HEIGHT:
    pcStack_10 = "Height";
    break;
  case aiTextureType_NORMALS:
    pcStack_10 = "Normals";
    break;
  case aiTextureType_SHININESS:
    pcStack_10 = "Shininess";
    break;
  case aiTextureType_OPACITY:
    pcStack_10 = "Opacity";
    break;
  case aiTextureType_DISPLACEMENT:
    pcStack_10 = "Displacement";
    break;
  case aiTextureType_LIGHTMAP:
    pcStack_10 = "Lightmap";
    break;
  case aiTextureType_REFLECTION:
    pcStack_10 = "Reflection";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/tools/assimp_cmd/WriteDumb.cpp"
                  ,0x34a,"const char *TextureTypeToString(aiTextureType)");
  case aiTextureType_UNKNOWN:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const char* TextureTypeToString(aiTextureType in)
{
	switch (in)
	{
	case aiTextureType_NONE:
		return "n/a";
	case aiTextureType_DIFFUSE:
		return "Diffuse";
	case aiTextureType_SPECULAR:
		return "Specular";
	case aiTextureType_AMBIENT:
		return "Ambient";
	case aiTextureType_EMISSIVE:
		return "Emissive";
	case aiTextureType_OPACITY:
		return "Opacity";
	case aiTextureType_NORMALS:
		return "Normals";
	case aiTextureType_HEIGHT:
		return "Height";
	case aiTextureType_SHININESS:
		return "Shininess";
	case aiTextureType_DISPLACEMENT:
		return "Displacement";
	case aiTextureType_LIGHTMAP:
		return "Lightmap";
	case aiTextureType_REFLECTION:
		return "Reflection";
	case aiTextureType_UNKNOWN:
		return "Unknown";
	default:
		break;
	}
	ai_assert(false); 
	return  "BUG";    
}